

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar4 = option::matches(&this->super_option,url,method);
  if (bVar4) {
    lVar5 = (long)this->select_[0];
    if (((lVar5 < 0) ||
        (ppVar2 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3) <=
        this->select_[0])) || ((long)ppVar2[lVar5].first == -1)) {
      pcVar6 = (char *)0x0;
      pcVar7 = (char *)0x0;
      bVar3 = false;
    }
    else {
      pcVar6 = (this->super_option).match_.begin_;
      pcVar7 = pcVar6 + ppVar2[lVar5].first;
      pcVar6 = pcVar6 + ppVar2[lVar5].second;
      bVar3 = true;
    }
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (bVar3) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar7,pcVar6);
    }
    else {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
    }
    if ((this->handle_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->handle_)._M_invoker)((_Any_data *)&this->handle_,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return bVar4;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}